

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrStructureTypeToString(XrInstance instance,XrStructureType value,char *buffer)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_34;
  LoaderInstance *pLStack_30;
  XrResult result;
  LoaderInstance *loader_instance;
  char *buffer_local;
  XrInstance pXStack_18;
  XrStructureType value_local;
  XrInstance instance_local;
  
  loader_instance = (LoaderInstance *)buffer;
  buffer_local._4_4_ = value;
  pXStack_18 = instance;
  local_34 = ActiveLoaderInstance::Get(&stack0xffffffffffffffd0,"xrStructureTypeToString");
  if (XR_ERROR_VALIDATION_FAILURE < local_34) {
    this = LoaderInstance::DispatchTable(pLStack_30);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_34 = (*pXVar1->StructureTypeToString)
                         (pXStack_18,buffer_local._4_4_,(char *)loader_instance);
  }
  return local_34;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrStructureTypeToString(
    XrInstance                                  instance,
    XrStructureType                             value,
    char                                        buffer[XR_MAX_STRUCTURE_NAME_SIZE]) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrStructureTypeToString");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->StructureTypeToString(instance, value, buffer);
    }
    return result;
}